

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainFrame.c
# Opt level: O3

void Abc_FrameDeallocate(Abc_Frame_t *p)

{
  void *__ptr;
  Abc_Ntk_t *pAVar1;
  Abc_Ntk_t *pNtk;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  Vec_Int_t *pVVar4;
  Vec_Str_t *__ptr_00;
  long lVar5;
  
  Rwt_ManGlobalStop();
  pVVar4 = p->vAbcObjIds;
  if (pVVar4 != (Vec_Int_t *)0x0) {
    if (pVVar4->pArray != (int *)0x0) {
      free(pVVar4->pArray);
    }
    free(pVVar4);
  }
  pVVar3 = p->vCexVec;
  if (pVVar3 != (Vec_Ptr_t *)0x0) {
    iVar2 = pVVar3->nSize;
    if (0 < iVar2) {
      lVar5 = 0;
      do {
        if ((void *)0x2 < pVVar3->pArray[lVar5]) {
          free(pVVar3->pArray[lVar5]);
          iVar2 = pVVar3->nSize;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < iVar2);
    }
    if (pVVar3->pArray != (void **)0x0) {
      free(pVVar3->pArray);
    }
    free(pVVar3);
  }
  pVVar3 = p->vPoEquivs;
  if (pVVar3 != (Vec_Ptr_t *)0x0) {
    iVar2 = pVVar3->nSize;
    if (0 < iVar2) {
      lVar5 = 0;
      do {
        __ptr = pVVar3->pArray[lVar5];
        if (__ptr != (void *)0x0) {
          if (*(void **)((long)__ptr + 8) != (void *)0x0) {
            free(*(void **)((long)__ptr + 8));
          }
          free(__ptr);
          iVar2 = pVVar3->nSize;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < iVar2);
    }
    if (pVVar3->pArray != (void **)0x0) {
      free(pVVar3->pArray);
    }
    free(pVVar3);
  }
  pVVar4 = p->vStatuses;
  if (pVVar4 != (Vec_Int_t *)0x0) {
    if (pVVar4->pArray != (int *)0x0) {
      free(pVVar4->pArray);
    }
    free(pVVar4);
  }
  if ((Dec_Man_t *)p->pManDec != (Dec_Man_t *)0x0) {
    Dec_ManStop((Dec_Man_t *)p->pManDec);
  }
  if (p->dd != (DdManager *)0x0) {
    Extra_StopManager(p->dd);
  }
  pVVar3 = p->vStore;
  if (pVVar3 != (Vec_Ptr_t *)0x0) {
    if (pVVar3->pArray != (void **)0x0) {
      free(pVVar3->pArray);
    }
    free(pVVar3);
  }
  if ((Aig_Man_t *)p->pSave1 != (Aig_Man_t *)0x0) {
    Aig_ManStop((Aig_Man_t *)p->pSave1);
  }
  if ((Aig_Man_t *)p->pSave2 != (Aig_Man_t *)0x0) {
    Aig_ManStop((Aig_Man_t *)p->pSave2);
  }
  if ((Aig_Man_t *)p->pSave3 != (Aig_Man_t *)0x0) {
    Aig_ManStop((Aig_Man_t *)p->pSave3);
  }
  if ((Aig_Man_t *)p->pSave4 != (Aig_Man_t *)0x0) {
    Aig_ManStop((Aig_Man_t *)p->pSave4);
  }
  if ((If_DsdMan_t *)p->pManDsd != (If_DsdMan_t *)0x0) {
    If_DsdManFree((If_DsdMan_t *)p->pManDsd,0);
  }
  if ((If_DsdMan_t *)p->pManDsd2 != (If_DsdMan_t *)0x0) {
    If_DsdManFree((If_DsdMan_t *)p->pManDsd2,0);
  }
  if (p->pNtkBackup != (Abc_Ntk_t *)0x0) {
    Abc_NtkDelete(p->pNtkBackup);
  }
  pVVar3 = p->vPlugInComBinPairs;
  if (pVVar3 != (Vec_Ptr_t *)0x0) {
    if (0 < pVVar3->nSize) {
      lVar5 = 0;
      do {
        if (pVVar3->pArray[lVar5] != (void *)0x0) {
          free(pVVar3->pArray[lVar5]);
          pVVar3 = p->vPlugInComBinPairs;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < pVVar3->nSize);
    }
    if (pVVar3->pArray != (void **)0x0) {
      free(pVVar3->pArray);
    }
    free(pVVar3);
  }
  pVVar4 = p->vIndFlops;
  if (pVVar4 != (Vec_Int_t *)0x0) {
    if (pVVar4->pArray != (int *)0x0) {
      free(pVVar4->pArray);
      p->vIndFlops->pArray = (int *)0x0;
      pVVar4 = p->vIndFlops;
      if (pVVar4 == (Vec_Int_t *)0x0) goto LAB_002f5371;
    }
    free(pVVar4);
    p->vIndFlops = (Vec_Int_t *)0x0;
  }
LAB_002f5371:
  pVVar3 = p->vLTLProperties_global;
  if (pVVar3 != (Vec_Ptr_t *)0x0) {
    if (pVVar3->pArray != (void **)0x0) {
      free(pVVar3->pArray);
      p->vLTLProperties_global->pArray = (void **)0x0;
      pVVar3 = p->vLTLProperties_global;
      if (pVVar3 == (Vec_Ptr_t *)0x0) goto LAB_002f53b9;
    }
    free(pVVar3);
    p->vLTLProperties_global = (Vec_Ptr_t *)0x0;
  }
LAB_002f53b9:
  pNtk = p->pNtkCur;
  while (pNtk != (Abc_Ntk_t *)0x0) {
    pAVar1 = pNtk->pNetBackup;
    Abc_NtkDelete(pNtk);
    pNtk = pAVar1;
  }
  p->pNtkCur = (Abc_Ntk_t *)0x0;
  if (p->pDrivingCell != (char *)0x0) {
    free(p->pDrivingCell);
    p->pDrivingCell = (char *)0x0;
  }
  if (p->pCex2 != (Abc_Cex_t *)0x0) {
    free(p->pCex2);
    p->pCex2 = (Abc_Cex_t *)0x0;
  }
  if (p->pCex != (Abc_Cex_t *)0x0) {
    free(p->pCex);
    p->pCex = (Abc_Cex_t *)0x0;
  }
  pVVar4 = p->pAbcWlcInv;
  if (pVVar4 != (Vec_Int_t *)0x0) {
    if (pVVar4->pArray != (int *)0x0) {
      free(pVVar4->pArray);
      p->pAbcWlcInv->pArray = (int *)0x0;
      pVVar4 = p->pAbcWlcInv;
      if (pVVar4 == (Vec_Int_t *)0x0) goto LAB_002f547a;
    }
    free(pVVar4);
    p->pAbcWlcInv = (Vec_Int_t *)0x0;
  }
LAB_002f547a:
  pVVar4 = p->pAbcWlcCnf;
  if (pVVar4 != (Vec_Int_t *)0x0) {
    if (pVVar4->pArray != (int *)0x0) {
      free(pVVar4->pArray);
      p->pAbcWlcCnf->pArray = (int *)0x0;
      pVVar4 = p->pAbcWlcCnf;
      if (pVVar4 == (Vec_Int_t *)0x0) goto LAB_002f54c2;
    }
    free(pVVar4);
    p->pAbcWlcCnf = (Vec_Int_t *)0x0;
  }
LAB_002f54c2:
  __ptr_00 = p->pAbcWlcStr;
  if (__ptr_00 != (Vec_Str_t *)0x0) {
    if (__ptr_00->pArray != (char *)0x0) {
      free(__ptr_00->pArray);
      p->pAbcWlcStr->pArray = (char *)0x0;
      __ptr_00 = p->pAbcWlcStr;
      if (__ptr_00 == (Vec_Str_t *)0x0) goto LAB_002f54ff;
    }
    free(__ptr_00);
  }
LAB_002f54ff:
  free(p);
  s_GlobalFrame = (Abc_Frame_t *)0x0;
  return;
}

Assistant:

void Abc_FrameDeallocate( Abc_Frame_t * p )
{
    extern void Rwt_ManGlobalStop();
    extern void undefine_cube_size();
//    extern void Ivy_TruthManStop();
//    Abc_HManStop();
//    undefine_cube_size();
    Rwt_ManGlobalStop();
//    Ivy_TruthManStop();
    if ( p->vAbcObjIds)  Vec_IntFree( p->vAbcObjIds );
    if ( p->vCexVec   )  Vec_PtrFreeFree( p->vCexVec );
    if ( p->vPoEquivs )  Vec_VecFree( (Vec_Vec_t *)p->vPoEquivs );
    if ( p->vStatuses )  Vec_IntFree( p->vStatuses );
    if ( p->pManDec   )  Dec_ManStop( (Dec_Man_t *)p->pManDec );
#ifdef ABC_USE_CUDD
    if ( p->dd        )  Extra_StopManager( p->dd );
#endif
    if ( p->vStore    )  Vec_PtrFree( p->vStore );
    if ( p->pSave1    )  Aig_ManStop( (Aig_Man_t *)p->pSave1 );
    if ( p->pSave2    )  Aig_ManStop( (Aig_Man_t *)p->pSave2 );
    if ( p->pSave3    )  Aig_ManStop( (Aig_Man_t *)p->pSave3 );
    if ( p->pSave4    )  Aig_ManStop( (Aig_Man_t *)p->pSave4 );
    if ( p->pManDsd   )  If_DsdManFree( (If_DsdMan_t *)p->pManDsd, 0 );
    if ( p->pManDsd2  )  If_DsdManFree( (If_DsdMan_t *)p->pManDsd2, 0 );
    if ( p->pNtkBackup)  Abc_NtkDelete( p->pNtkBackup );
    if ( p->vPlugInComBinPairs ) 
    {
        char * pTemp;
        int i;
        Vec_PtrForEachEntry( char *, p->vPlugInComBinPairs, pTemp, i )
            ABC_FREE( pTemp );
        Vec_PtrFree( p->vPlugInComBinPairs );
    }
    Vec_IntFreeP( &p->vIndFlops );
    Vec_PtrFreeP( &p->vLTLProperties_global );
    Abc_FrameDeleteAllNetworks( p );
    ABC_FREE( p->pDrivingCell );
    ABC_FREE( p->pCex2 );
    ABC_FREE( p->pCex );
    Vec_IntFreeP( &p->pAbcWlcInv );
    Vec_IntFreeP( &p->pAbcWlcCnf );
    Vec_StrFreeP( &p->pAbcWlcStr );
    ABC_FREE( p );
    s_GlobalFrame = NULL;
}